

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja_test.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  char *local_b8;
  allocator<char> local_91;
  string local_90;
  string local_60;
  Test *local_40;
  Test *test;
  int i_1;
  uint uStack_2c;
  bool passed;
  int i;
  int nactivetests;
  char *test_filter;
  char **ppcStack_18;
  int tests_started;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  test_filter._4_4_ = 0;
  _i = "*";
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  bVar1 = anon_unknown.dwarf_bc70f::ReadFlags
                    ((int *)&argv_local,&stack0xffffffffffffffe8,(char **)&i);
  if (bVar1) {
    uStack_2c = 0;
    for (i_1 = 0; i_1 < ntests; i_1 = i_1 + 1) {
      bVar1 = anon_unknown.dwarf_bc70f::TestMatchesFilter(tests[i_1].name,_i);
      *(bool *)((long)i_1 * 0x18 + 0x2aa830) = bVar1;
      if (bVar1) {
        uStack_2c = uStack_2c + 1;
      }
    }
    test._7_1_ = 1;
    for (test._0_4_ = 0; (int)test < ntests; test._0_4_ = (int)test + 1) {
      if ((tests[(int)test].should_run & 1U) != 0) {
        test_filter._4_4_ = test_filter._4_4_ + 1;
        local_40 = (*tests[(int)test].factory)();
        (anonymous_namespace)::StringPrintf_abi_cxx11_
                  (&local_60,"[%d/%d] %s",(ulong)test_filter._4_4_,(ulong)uStack_2c,
                   tests[(int)test].name);
        LinePrinter::Print(&printer,&local_60,ELIDE);
        std::__cxx11::string::~string((string *)&local_60);
        (*local_40->_vptr_Test[2])();
        (*local_40->_vptr_Test[4])();
        (*local_40->_vptr_Test[3])();
        bVar1 = testing::Test::Failed(local_40);
        if (bVar1) {
          test._7_1_ = 0;
        }
        if (local_40 != (Test *)0x0) {
          (*local_40->_vptr_Test[1])();
        }
      }
    }
    if ((test._7_1_ & 1) == 0) {
      local_b8 = "failed\n";
    }
    else {
      local_b8 = "passed\n";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_b8,&local_91);
    LinePrinter::PrintOnNewLine(&printer,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    argv_local._4_4_ = (uint)((test._7_1_ & 1) == 0);
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  int tests_started = 0;

  const char* test_filter = "*";
  if (!ReadFlags(&argc, &argv, &test_filter))
    return 1;

  int nactivetests = 0;
  for (int i = 0; i < ntests; i++)
    if ((tests[i].should_run = TestMatchesFilter(tests[i].name, test_filter)))
      ++nactivetests;

  bool passed = true;
  for (int i = 0; i < ntests; i++) {
    if (!tests[i].should_run) continue;

    ++tests_started;
    testing::Test* test = tests[i].factory();
    printer.Print(
        StringPrintf("[%d/%d] %s", tests_started, nactivetests, tests[i].name),
        LinePrinter::ELIDE);
    test->SetUp();
    test->Run();
    test->TearDown();
    if (test->Failed())
      passed = false;
    delete test;
  }

  printer.PrintOnNewLine(passed ? "passed\n" : "failed\n");
  return passed ? EXIT_SUCCESS : EXIT_FAILURE;
}